

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::ObserveEventsRequest::ParseFromArray
          (ObserveEventsRequest *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pOVar2;
  iterator __position;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *puVar9;
  bool bVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  uint uVar15;
  ulong *in_R11;
  uint *puVar16;
  bool bVar17;
  ulong local_60;
  Field local_50;
  vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
  *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pOVar2 = (this->events_to_observe_).
           super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->events_to_observe_).
      super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
      ._M_impl.super__Vector_impl_data._M_finish != pOVar2) {
    (this->events_to_observe_).
    super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
    ._M_impl.super__Vector_impl_data._M_finish = pOVar2;
  }
  local_40 = &this->events_to_observe_;
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar7 = (ulong *)(size + (long)raw);
  do {
    lVar4 = 7;
    if (puVar7 <= raw) goto LAB_0026580c;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar9 = (ulong *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar3 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar13 = puVar9;
      for (; (uVar12 = uVar3, puVar11 = puVar13, (char)bVar1 < '\0' &&
             (bVar17 = 0x38 < lVar4 - 7U, bVar10 = bVar17 || puVar7 <= puVar13, uVar12 = 0,
             puVar11 = puVar9, !bVar17 && puVar7 > puVar13)); lVar4 = lVar4 + 7) {
        bVar1 = (byte)*puVar13;
        in_R11 = (ulong *)((ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f));
        puVar13 = (ulong *)((long)puVar13 + 1);
        uVar3 = uVar3 | (ulong)in_R11;
      }
      puVar9 = puVar11;
      if (bVar10) {
        puVar9 = (ulong *)raw;
        uVar12 = 0;
      }
      if (puVar9 == (ulong *)raw) goto LAB_0026580c;
    }
    uVar5 = (uint)(uVar12 >> 3);
    if ((uVar5 == 0) || (puVar7 <= puVar9)) {
switchD_00265691_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      local_50.int_value_ = 0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        uVar6 = 0;
        bVar10 = puVar9 >= puVar7;
        if (puVar9 < puVar7) {
          puVar13 = (ulong *)((long)puVar9 + 1);
          bVar1 = (byte)*puVar9;
          uVar8 = (ulong)(bVar1 & 0x7f);
          uVar3 = 0;
          uVar14 = uVar8;
          if ((char)bVar1 < '\0') {
            uVar14 = 0;
          }
          uVar15 = (uint)uVar14;
          in_R11 = puVar13;
          if ((char)bVar1 < '\0') {
            uVar3 = 0;
            lVar4 = 7;
            puVar11 = puVar13;
            do {
              uVar15 = (uint)uVar14;
              bVar10 = 0x38 < lVar4 - 7U || puVar7 <= puVar11;
              in_R11 = puVar13;
              if (bVar10) break;
              bVar1 = (byte)*puVar11;
              in_R11 = (ulong *)((long)puVar11 + 1);
              uVar8 = uVar8 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 7;
              if ((char)bVar1 >= '\0') {
                uVar14 = uVar8 & 0xffffffff;
                uVar3 = uVar8 >> 0x20;
              }
              uVar15 = (uint)uVar14;
              puVar11 = in_R11;
            } while ((char)bVar1 < '\0');
          }
        }
        else {
          uVar3 = 0;
          uVar15 = 0;
        }
        if (bVar10) {
          uVar3 = 0;
          in_R11 = puVar9;
          uVar15 = 0;
        }
        if (in_R11 != puVar9) goto LAB_00265834;
        uVar12 = 0;
        bVar10 = false;
        local_50.int_value_ = uVar6;
        goto LAB_0026587f;
      case 1:
        in_R11 = puVar9 + 1;
        if (puVar7 < in_R11) {
LAB_0026580c:
          uVar12 = 0;
          bVar10 = false;
          local_50.int_value_ = 0;
          goto LAB_0026587f;
        }
        uVar6 = *puVar9;
        uVar3 = uVar6 >> 0x20;
        break;
      case 2:
        bVar10 = puVar9 >= puVar7;
        uVar3 = local_60;
        if (puVar9 < puVar7) {
          puVar13 = (ulong *)((long)puVar9 + 1);
          uVar6 = (ulong)((byte)*puVar9 & 0x7f);
          uVar3 = uVar6;
          in_R11 = puVar13;
          if ((char)(byte)*puVar9 < '\0') {
            lVar4 = 7;
            puVar11 = puVar13;
            do {
              bVar10 = 0x38 < lVar4 - 7U || puVar7 <= puVar11;
              uVar3 = local_60;
              in_R11 = puVar13;
              if (bVar10) break;
              uVar14 = *puVar11;
              puVar11 = (ulong *)((long)puVar11 + 1);
              uVar6 = uVar6 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar4 & 0x3f);
              lVar4 = lVar4 + 7;
              uVar3 = uVar6;
              in_R11 = puVar11;
            } while ((char)(byte)uVar14 < '\0');
          }
        }
        local_60 = uVar3;
        if (bVar10) {
          in_R11 = puVar9;
          local_60 = 0;
        }
        if ((in_R11 == puVar9) || ((ulong)((long)puVar7 - (long)in_R11) < local_60)) {
          uVar3 = 0;
          uVar15 = 0;
          bVar10 = false;
          uVar6 = 0;
        }
        else {
          uVar3 = (ulong)in_R11 >> 0x20;
          uVar15 = (uint)in_R11;
          in_R11 = (ulong *)((long)in_R11 + local_60);
          bVar10 = true;
          uVar6 = local_60;
        }
        if (!bVar10) goto LAB_0026580c;
        goto LAB_00265834;
      default:
        goto switchD_00265691_caseD_3;
      case 5:
        in_R11 = (ulong *)((long)puVar9 + 4);
        uVar3 = 0;
        if (puVar7 < in_R11) goto LAB_0026580c;
        uVar6 = (ulong)(uint)*puVar9;
      }
      uVar15 = (uint)uVar6;
      uVar6 = 0;
LAB_00265834:
      bVar10 = true;
      raw = in_R11;
      if ((uVar5 < 0x10000) && (uVar6 < 0x10000000)) {
        local_50.int_value_ = (ulong)uVar15 | uVar3 << 0x20;
        uVar12 = uVar6 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        local_50.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_0026587f:
    uVar3 = 7;
    puVar16 = &switchD_00265691::switchdataD_0034f170;
    if (!bVar10) {
      do {
        local_50.size_ = (uint32_t)uVar12;
        local_50.type_ = (uint8_t)(uVar12 >> 0x30);
        local_50.id_ = (uint16_t)(uVar12 >> 0x20);
        if (local_50.id_ == 1) {
          *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
               (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
          __position._M_current =
               (this->events_to_observe_).
               super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->events_to_observe_).
              super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
            ::_M_realloc_insert<>(local_40,__position);
          }
          else {
            *__position._M_current = ObservableEvents_Type_TYPE_UNSPECIFIED;
            (this->events_to_observe_).
            super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
            ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          (this->events_to_observe_).
          super__Vector_base<perfetto::protos::gen::ObservableEvents_Type,_std::allocator<perfetto::protos::gen::ObservableEvents_Type>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1] =
               (ObservableEvents_Type)local_50.int_value_;
        }
        else {
          if (local_50.id_ == 0) {
            return puVar7 == (ulong *)raw;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_50,local_38);
        }
        do {
          if (puVar7 <= raw) goto LAB_00265a2c;
          uVar12 = (ulong)(char)(byte)*raw;
          puVar9 = (ulong *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar12 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            puVar13 = puVar9;
            if ((char)(byte)*raw < '\0') {
              lVar4 = 7;
              uVar6 = uVar12;
              puVar11 = puVar9;
              do {
                bVar10 = 0x38 < lVar4 - 7U || puVar7 <= puVar11;
                uVar12 = 0;
                puVar13 = puVar9;
                if (bVar10) break;
                uVar14 = *puVar11;
                puVar13 = (ulong *)((long)puVar11 + 1);
                uVar12 = uVar6 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar4 & 0x3f);
                lVar4 = lVar4 + 7;
                uVar6 = uVar12;
                puVar11 = puVar13;
              } while ((char)(byte)uVar14 < '\0');
            }
            puVar9 = puVar13;
            if (bVar10) {
              puVar9 = (ulong *)raw;
              uVar12 = 0;
            }
            if (puVar9 == (ulong *)raw) goto LAB_00265a2c;
          }
          uVar5 = (uint)(uVar12 >> 3);
          if ((uVar5 == 0) || (puVar7 <= puVar9)) {
switchD_00265ab7_caseD_3:
            local_50.int_value_ = 0;
            bVar10 = false;
            uVar12 = 0;
            goto LAB_00265cb4;
          }
          switch((uint)uVar12 & 7) {
          case 0:
            local_50.int_value_ = 0;
            bVar10 = puVar9 >= puVar7;
            if (puVar9 < puVar7) {
              puVar13 = (ulong *)((long)puVar9 + 1);
              uVar15 = (byte)*puVar9 & 0x7f;
              uVar6 = (ulong)uVar15;
              uVar14 = (ulong)uVar15;
              puVar16 = (uint *)puVar13;
              uVar15 = 0;
              if ((char)(byte)*puVar9 < '\0') {
                uVar14 = 0;
                lVar4 = 7;
                puVar11 = puVar13;
                do {
                  bVar17 = 0x38 < lVar4 - 7U;
                  bVar10 = bVar17 || puVar7 <= puVar11;
                  puVar16 = (uint *)puVar13;
                  uVar15 = 0;
                  if (bVar17 || puVar7 <= puVar11) break;
                  bVar1 = (byte)*puVar11;
                  puVar11 = (ulong *)((long)puVar11 + 1);
                  uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)lVar4 & 0x3f);
                  lVar4 = lVar4 + 7;
                  if (-1 < (char)bVar1) {
                    uVar14 = uVar6 & 0xffffffff;
                  }
                  puVar16 = (uint *)puVar11;
                  uVar15 = (uint)(uVar6 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar14 = 0;
              uVar15 = 0;
            }
            if (bVar10) {
              uVar14 = local_50.int_value_;
            }
            uVar6 = (ulong)uVar15;
            if (bVar10) {
              puVar16 = (uint *)puVar9;
              uVar6 = local_50.int_value_;
            }
            uVar8 = local_50.int_value_;
            if ((ulong *)puVar16 == puVar9) {
              uVar12 = 0;
              bVar10 = false;
            }
            else {
LAB_00265c73:
              raw = puVar16;
              bVar10 = true;
              puVar16 = (uint *)raw;
              if ((uVar5 < 0x10000) && (uVar8 < 0x10000000)) {
                local_50.int_value_ = uVar14 & 0xffffffff | uVar6 << 0x20;
                uVar12 = uVar8 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
                bVar10 = false;
              }
              else {
                local_50.int_value_ = 0;
                uVar12 = 0;
              }
            }
            break;
          case 1:
            puVar16 = (uint *)(puVar9 + 1);
            if (puVar16 <= puVar7) {
              uVar14 = *puVar9;
              uVar6 = uVar14 >> 0x20;
LAB_00265b18:
              uVar8 = 0;
              goto LAB_00265c73;
            }
            goto LAB_00265a2c;
          case 2:
            bVar10 = puVar9 >= puVar7;
            uVar6 = uVar3;
            if (puVar9 < puVar7) {
              puVar13 = (ulong *)((long)puVar9 + 1);
              uVar14 = (ulong)((byte)*puVar9 & 0x7f);
              uVar6 = uVar14;
              puVar16 = (uint *)puVar13;
              if ((char)(byte)*puVar9 < '\0') {
                lVar4 = 7;
                puVar11 = puVar13;
                do {
                  bVar10 = 0x38 < lVar4 - 7U || puVar7 <= puVar11;
                  uVar6 = uVar3;
                  puVar16 = (uint *)puVar13;
                  if (bVar10) break;
                  uVar8 = *puVar11;
                  puVar11 = (ulong *)((long)puVar11 + 1);
                  uVar14 = uVar14 | (ulong)((byte)uVar8 & 0x7f) << ((byte)lVar4 & 0x3f);
                  lVar4 = lVar4 + 7;
                  uVar6 = uVar14;
                  puVar16 = (uint *)puVar11;
                } while ((char)(byte)uVar8 < '\0');
              }
            }
            uVar3 = uVar6;
            if (bVar10) {
              puVar16 = (uint *)puVar9;
              uVar3 = 0;
            }
            if (((ulong *)puVar16 == puVar9) || ((ulong)((long)puVar7 - (long)puVar16) < uVar3)) {
              uVar14 = 0;
              uVar6 = 0;
              bVar10 = false;
              uVar8 = 0;
            }
            else {
              uVar6 = (ulong)puVar16 >> 0x20;
              uVar14 = (ulong)puVar16 & 0xffffffff;
              puVar16 = (uint *)((long)puVar16 + uVar3);
              bVar10 = true;
              uVar8 = uVar3;
            }
            if (bVar10) goto LAB_00265c73;
            local_50.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
            break;
          default:
            goto switchD_00265ab7_caseD_3;
          case 5:
            puVar16 = (uint *)((long)puVar9 + 4);
            uVar6 = 0;
            if (puVar16 <= puVar7) {
              uVar14 = (ulong)(uint)*puVar9;
              goto LAB_00265b18;
            }
LAB_00265a2c:
            local_50.int_value_ = 0;
            uVar12 = 0;
            bVar10 = false;
          }
LAB_00265cb4:
        } while (bVar10);
      } while( true );
    }
  } while( true );
}

Assistant:

bool ObserveEventsRequest::ParseFromArray(const void* raw, size_t size) {
  events_to_observe_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* events_to_observe */:
        events_to_observe_.emplace_back();
        field.get(&events_to_observe_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}